

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

int __thiscall pybind11::detail::enum_base::init(enum_base *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  internals *piVar1;
  byte in_DL;
  str_attr_accessor local_6c8;
  is_method local_6a8;
  name local_6a0;
  type local_691;
  cpp_function local_690;
  str_attr_accessor local_688;
  is_method local_668;
  name local_660;
  type local_651;
  cpp_function local_650;
  str_attr_accessor local_648;
  is_method local_628;
  name local_620;
  type local_611;
  cpp_function local_610;
  str_attr_accessor local_608;
  is_method local_5e8;
  name local_5e0;
  type local_5d1;
  cpp_function local_5d0;
  str_attr_accessor local_5c8;
  is_method local_5a8;
  name local_5a0;
  type local_591;
  cpp_function local_590;
  str_attr_accessor local_588;
  is_method local_568;
  name local_560;
  type local_551;
  cpp_function local_550;
  str_attr_accessor local_548;
  is_method local_528;
  name local_520;
  type local_511;
  cpp_function local_510;
  str_attr_accessor local_508;
  is_method local_4e8;
  name local_4e0;
  type local_4d1;
  cpp_function local_4d0;
  str_attr_accessor local_4c8;
  is_method local_4a8;
  name local_4a0;
  type local_491;
  cpp_function local_490;
  str_attr_accessor local_488;
  is_method local_468;
  name local_460;
  type local_451;
  cpp_function local_450;
  str_attr_accessor local_448;
  is_method local_428;
  name local_420;
  type local_411;
  cpp_function local_410;
  str_attr_accessor local_408;
  is_method local_3e8;
  name local_3e0;
  type local_3d1;
  cpp_function local_3d0;
  str_attr_accessor local_3c8;
  is_method local_3a8;
  name local_3a0;
  type local_391;
  cpp_function local_390;
  str_attr_accessor local_388;
  is_method local_368;
  name local_360;
  type local_351;
  cpp_function local_350;
  str_attr_accessor local_348;
  is_method local_328;
  name local_320;
  type local_311;
  cpp_function local_310;
  str_attr_accessor local_308;
  is_method local_2e8;
  name local_2e0;
  type local_2d1;
  cpp_function local_2d0;
  str_attr_accessor local_2c8;
  is_method local_2a8;
  name local_2a0;
  type local_291;
  cpp_function local_290;
  str_attr_accessor local_288;
  is_method local_268;
  name local_260;
  type local_251;
  cpp_function local_250;
  str_attr_accessor local_248;
  is_method local_228;
  name local_220;
  type local_211;
  cpp_function local_210;
  str_attr_accessor local_208;
  is_method local_1e8;
  name local_1e0;
  type local_1d1;
  cpp_function local_1d0;
  str_attr_accessor local_1c8;
  is_method local_1a8;
  name local_1a0;
  type local_191;
  cpp_function local_190;
  str_attr_accessor local_188;
  none local_168;
  none local_160;
  name local_158;
  type local_149;
  cpp_function local_148;
  object local_140;
  str_attr_accessor local_138;
  none local_118;
  none local_110;
  name local_108;
  type local_f9;
  cpp_function local_f8;
  object local_f0;
  str_attr_accessor local_e8;
  is_method local_c8;
  name local_c0;
  type local_b1;
  cpp_function local_b0;
  object local_a8;
  str_attr_accessor local_a0;
  is_method local_80;
  name local_78;
  type local_69;
  cpp_function local_68;
  handle local_60;
  handle static_property;
  handle property;
  str_attr_accessor local_40;
  dict local_20;
  byte local_12;
  byte local_11;
  bool is_convertible_local;
  enum_base *peStack_10;
  bool is_arithmetic_local;
  enum_base *this_local;
  
  local_11 = (byte)ctx & 1;
  local_12 = in_DL & 1;
  peStack_10 = this;
  dict::dict(&local_20);
  object_api<pybind11::handle>::attr(&local_40,(object_api<pybind11::handle> *)this,"__entries");
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_40,&local_20);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_40);
  dict::~dict(&local_20);
  handle::handle(&static_property,(PyObject *)&PyProperty_Type);
  piVar1 = get_internals();
  handle::handle(&local_60,(PyObject *)piVar1->static_property_type);
  pybind11::name::name(&local_78,"__repr__");
  is_method::is_method(&local_80,&this->m_base);
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::handle)_1_,pybind11::name,pybind11::is_method,void>
            (&local_68,&local_69,&local_78,&local_80);
  object_api<pybind11::handle>::attr(&local_a0,(object_api<pybind11::handle> *)this,"__repr__");
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_a0,&local_68);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_a0);
  cpp_function::~cpp_function(&local_68);
  pybind11::name::name(&local_c0,"name");
  is_method::is_method(&local_c8,&this->m_base);
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::handle)_2_,pybind11::name,pybind11::is_method,void>
            (&local_b0,&local_b1,&local_c0,&local_c8);
  object_api<pybind11::handle>::operator()
            ((object_api<pybind11::handle> *)&local_a8,(cpp_function *)&static_property);
  object_api<pybind11::handle>::attr(&local_e8,(object_api<pybind11::handle> *)this,"name");
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_e8,&local_a8);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_e8);
  object::~object(&local_a8);
  cpp_function::~cpp_function(&local_b0);
  pybind11::name::name(&local_108,"__doc__");
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::handle)_3_,pybind11::name,void>
            (&local_f8,&local_f9,&local_108);
  none::none(&local_110);
  none::none(&local_118);
  object_api<pybind11::handle>::operator()
            ((object_api<pybind11::handle> *)&local_f0,(cpp_function *)&local_60,(none *)&local_f8,
             &local_110,(char (*) [1])&local_118);
  object_api<pybind11::handle>::attr(&local_138,(object_api<pybind11::handle> *)this,"__doc__");
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_138,&local_f0);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_138);
  object::~object(&local_f0);
  none::~none(&local_118);
  none::~none(&local_110);
  cpp_function::~cpp_function(&local_f8);
  pybind11::name::name(&local_158,"__members__");
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::handle)_4_,pybind11::name,void>
            (&local_148,&local_149,&local_158);
  none::none(&local_160);
  none::none(&local_168);
  object_api<pybind11::handle>::operator()
            ((object_api<pybind11::handle> *)&local_140,(cpp_function *)&local_60,(none *)&local_148
             ,&local_160,(char (*) [1])&local_168);
  object_api<pybind11::handle>::attr(&local_188,(object_api<pybind11::handle> *)this,"__members__");
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_188,&local_140);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_188);
  object::~object(&local_140);
  none::~none(&local_168);
  none::~none(&local_160);
  cpp_function::~cpp_function(&local_148);
  if ((local_12 & 1) == 0) {
    pybind11::name::name(&local_4e0,"__eq__");
    is_method::is_method(&local_4e8,&this->m_base);
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_13_,pybind11::name,pybind11::is_method,void>
              (&local_4d0,&local_4d1,&local_4e0,&local_4e8);
    object_api<pybind11::handle>::attr(&local_508,(object_api<pybind11::handle> *)this,"__eq__");
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_508,&local_4d0);
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_508);
    cpp_function::~cpp_function(&local_4d0);
    pybind11::name::name(&local_520,"__ne__");
    is_method::is_method(&local_528,&this->m_base);
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_14_,pybind11::name,pybind11::is_method,void>
              (&local_510,&local_511,&local_520,&local_528);
    object_api<pybind11::handle>::attr(&local_548,(object_api<pybind11::handle> *)this,"__ne__");
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_548,&local_510);
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_548);
    cpp_function::~cpp_function(&local_510);
    if ((local_11 & 1) != 0) {
      pybind11::name::name(&local_560,"__lt__");
      is_method::is_method(&local_568,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_15_,pybind11::name,pybind11::is_method,void>
                (&local_550,&local_551,&local_560,&local_568);
      object_api<pybind11::handle>::attr(&local_588,(object_api<pybind11::handle> *)this,"__lt__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_588,&local_550);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_588);
      cpp_function::~cpp_function(&local_550);
      pybind11::name::name(&local_5a0,"__gt__");
      is_method::is_method(&local_5a8,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_16_,pybind11::name,pybind11::is_method,void>
                (&local_590,&local_591,&local_5a0,&local_5a8);
      object_api<pybind11::handle>::attr(&local_5c8,(object_api<pybind11::handle> *)this,"__gt__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_5c8,&local_590);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_5c8);
      cpp_function::~cpp_function(&local_590);
      pybind11::name::name(&local_5e0,"__le__");
      is_method::is_method(&local_5e8,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_17_,pybind11::name,pybind11::is_method,void>
                (&local_5d0,&local_5d1,&local_5e0,&local_5e8);
      object_api<pybind11::handle>::attr(&local_608,(object_api<pybind11::handle> *)this,"__le__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_608,&local_5d0);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_608);
      cpp_function::~cpp_function(&local_5d0);
      pybind11::name::name(&local_620,"__ge__");
      is_method::is_method(&local_628,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_18_,pybind11::name,pybind11::is_method,void>
                (&local_610,&local_611,&local_620,&local_628);
      object_api<pybind11::handle>::attr(&local_648,(object_api<pybind11::handle> *)this,"__ge__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_648,&local_610);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_648);
      cpp_function::~cpp_function(&local_610);
    }
  }
  else {
    pybind11::name::name(&local_1a0,"__eq__");
    is_method::is_method(&local_1a8,&this->m_base);
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_1_,pybind11::name,pybind11::is_method,void>
              (&local_190,&local_191,&local_1a0,&local_1a8);
    object_api<pybind11::handle>::attr(&local_1c8,(object_api<pybind11::handle> *)this,"__eq__");
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_1c8,&local_190);
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_1c8);
    cpp_function::~cpp_function(&local_190);
    pybind11::name::name(&local_1e0,"__ne__");
    is_method::is_method(&local_1e8,&this->m_base);
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_2_,pybind11::name,pybind11::is_method,void>
              (&local_1d0,&local_1d1,&local_1e0,&local_1e8);
    object_api<pybind11::handle>::attr(&local_208,(object_api<pybind11::handle> *)this,"__ne__");
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_208,&local_1d0);
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_208);
    cpp_function::~cpp_function(&local_1d0);
    if ((local_11 & 1) != 0) {
      pybind11::name::name(&local_220,"__lt__");
      is_method::is_method(&local_228,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_3_,pybind11::name,pybind11::is_method,void>
                (&local_210,&local_211,&local_220,&local_228);
      object_api<pybind11::handle>::attr(&local_248,(object_api<pybind11::handle> *)this,"__lt__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_248,&local_210);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_248);
      cpp_function::~cpp_function(&local_210);
      pybind11::name::name(&local_260,"__gt__");
      is_method::is_method(&local_268,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_4_,pybind11::name,pybind11::is_method,void>
                (&local_250,&local_251,&local_260,&local_268);
      object_api<pybind11::handle>::attr(&local_288,(object_api<pybind11::handle> *)this,"__gt__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_288,&local_250);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_288);
      cpp_function::~cpp_function(&local_250);
      pybind11::name::name(&local_2a0,"__le__");
      is_method::is_method(&local_2a8,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_5_,pybind11::name,pybind11::is_method,void>
                (&local_290,&local_291,&local_2a0,&local_2a8);
      object_api<pybind11::handle>::attr(&local_2c8,(object_api<pybind11::handle> *)this,"__le__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_2c8,&local_290);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_2c8);
      cpp_function::~cpp_function(&local_290);
      pybind11::name::name(&local_2e0,"__ge__");
      is_method::is_method(&local_2e8,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_6_,pybind11::name,pybind11::is_method,void>
                (&local_2d0,&local_2d1,&local_2e0,&local_2e8);
      object_api<pybind11::handle>::attr(&local_308,(object_api<pybind11::handle> *)this,"__ge__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_308,&local_2d0);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_308);
      cpp_function::~cpp_function(&local_2d0);
      pybind11::name::name(&local_320,"__and__");
      is_method::is_method(&local_328,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_7_,pybind11::name,pybind11::is_method,void>
                (&local_310,&local_311,&local_320,&local_328);
      object_api<pybind11::handle>::attr(&local_348,(object_api<pybind11::handle> *)this,"__and__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_348,&local_310);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_348);
      cpp_function::~cpp_function(&local_310);
      pybind11::name::name(&local_360,"__rand__");
      is_method::is_method(&local_368,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_8_,pybind11::name,pybind11::is_method,void>
                (&local_350,&local_351,&local_360,&local_368);
      object_api<pybind11::handle>::attr(&local_388,(object_api<pybind11::handle> *)this,"__rand__")
      ;
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_388,&local_350);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_388);
      cpp_function::~cpp_function(&local_350);
      pybind11::name::name(&local_3a0,"__or__");
      is_method::is_method(&local_3a8,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_9_,pybind11::name,pybind11::is_method,void>
                (&local_390,&local_391,&local_3a0,&local_3a8);
      object_api<pybind11::handle>::attr(&local_3c8,(object_api<pybind11::handle> *)this,"__or__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_3c8,&local_390);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_3c8);
      cpp_function::~cpp_function(&local_390);
      pybind11::name::name(&local_3e0,"__ror__");
      is_method::is_method(&local_3e8,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_10_,pybind11::name,pybind11::is_method,void>
                (&local_3d0,&local_3d1,&local_3e0,&local_3e8);
      object_api<pybind11::handle>::attr(&local_408,(object_api<pybind11::handle> *)this,"__ror__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_408,&local_3d0);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_408);
      cpp_function::~cpp_function(&local_3d0);
      pybind11::name::name(&local_420,"__xor__");
      is_method::is_method(&local_428,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_11_,pybind11::name,pybind11::is_method,void>
                (&local_410,&local_411,&local_420,&local_428);
      object_api<pybind11::handle>::attr(&local_448,(object_api<pybind11::handle> *)this,"__xor__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_448,&local_410);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_448);
      cpp_function::~cpp_function(&local_410);
      pybind11::name::name(&local_460,"__rxor__");
      is_method::is_method(&local_468,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_12_,pybind11::name,pybind11::is_method,void>
                (&local_450,&local_451,&local_460,&local_468);
      object_api<pybind11::handle>::attr(&local_488,(object_api<pybind11::handle> *)this,"__rxor__")
      ;
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_488,&local_450);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_488);
      cpp_function::~cpp_function(&local_450);
      pybind11::name::name(&local_4a0,"__invert__");
      is_method::is_method(&local_4a8,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object)_1_,pybind11::name,pybind11::is_method,void>
                (&local_490,&local_491,&local_4a0,&local_4a8);
      object_api<pybind11::handle>::attr
                (&local_4c8,(object_api<pybind11::handle> *)this,"__invert__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_4c8,&local_490);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_4c8);
      cpp_function::~cpp_function(&local_490);
    }
  }
  pybind11::name::name(&local_660,"__getstate__");
  is_method::is_method(&local_668,&this->m_base);
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object)_2_,pybind11::name,pybind11::is_method,void>
            (&local_650,&local_651,&local_660,&local_668);
  object_api<pybind11::handle>::attr(&local_688,(object_api<pybind11::handle> *)this,"__getstate__")
  ;
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_688,&local_650);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_688);
  cpp_function::~cpp_function(&local_650);
  pybind11::name::name(&local_6a0,"__hash__");
  is_method::is_method(&local_6a8,&this->m_base);
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object)_3_,pybind11::name,pybind11::is_method,void>
            (&local_690,&local_691,&local_6a0,&local_6a8);
  object_api<pybind11::handle>::attr(&local_6c8,(object_api<pybind11::handle> *)this,"__hash__");
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_6c8,&local_690);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_6c8);
  cpp_function::~cpp_function(&local_690);
  return extraout_EAX;
}

Assistant:

PYBIND11_NOINLINE void init(bool is_arithmetic, bool is_convertible) {
        m_base.attr("__entries") = dict();
        auto property = handle((PyObject *) &PyProperty_Type);
        auto static_property = handle((PyObject *) get_internals().static_property_type);

        m_base.attr("__repr__") = cpp_function(
            [](handle arg) -> str {
                handle type = arg.get_type();
                object type_name = type.attr("__name__");
                dict entries = type.attr("__entries");
                for (const auto &kv : entries) {
                    object other = kv.second[int_(0)];
                    if (other.equal(arg))
                        return pybind11::str("{}.{}").format(type_name, kv.first);
                }
                return pybind11::str("{}.???").format(type_name);
            }, name("__repr__"), is_method(m_base)
        );

        m_base.attr("name") = property(cpp_function(
            [](handle arg) -> str {
                dict entries = arg.get_type().attr("__entries");
                for (const auto &kv : entries) {
                    if (handle(kv.second[int_(0)]).equal(arg))
                        return pybind11::str(kv.first);
                }
                return "???";
            }, name("name"), is_method(m_base)
        ));

        m_base.attr("__doc__") = static_property(cpp_function(
            [](handle arg) -> std::string {
                std::string docstring;
                dict entries = arg.attr("__entries");
                if (((PyTypeObject *) arg.ptr())->tp_doc)
                    docstring += std::string(((PyTypeObject *) arg.ptr())->tp_doc) + "\n\n";
                docstring += "Members:";
                for (const auto &kv : entries) {
                    auto key = std::string(pybind11::str(kv.first));
                    auto comment = kv.second[int_(1)];
                    docstring += "\n\n  " + key;
                    if (!comment.is_none())
                        docstring += " : " + (std::string) pybind11::str(comment);
                }
                return docstring;
            }, name("__doc__")
        ), none(), none(), "");

        m_base.attr("__members__") = static_property(cpp_function(
            [](handle arg) -> dict {
                dict entries = arg.attr("__entries"), m;
                for (const auto &kv : entries)
                    m[kv.first] = kv.second[int_(0)];
                return m;
            }, name("__members__")), none(), none(), ""
        );

        #define PYBIND11_ENUM_OP_STRICT(op, expr, strict_behavior)                     \
            m_base.attr(op) = cpp_function(                                            \
                [](object a, object b) {                                               \
                    if (!a.get_type().is(b.get_type()))                                \
                        strict_behavior;                                               \
                    return expr;                                                       \
                },                                                                     \
                name(op), is_method(m_base))

        #define PYBIND11_ENUM_OP_CONV(op, expr)                                        \
            m_base.attr(op) = cpp_function(                                            \
                [](object a_, object b_) {                                             \
                    int_ a(a_), b(b_);                                                 \
                    return expr;                                                       \
                },                                                                     \
                name(op), is_method(m_base))

        #define PYBIND11_ENUM_OP_CONV_LHS(op, expr)                                    \
            m_base.attr(op) = cpp_function(                                            \
                [](object a_, object b) {                                              \
                    int_ a(a_);                                                        \
                    return expr;                                                       \
                },                                                                     \
                name(op), is_method(m_base))

        if (is_convertible) {
            PYBIND11_ENUM_OP_CONV_LHS("__eq__", !b.is_none() &&  a.equal(b));
            PYBIND11_ENUM_OP_CONV_LHS("__ne__",  b.is_none() || !a.equal(b));

            if (is_arithmetic) {
                PYBIND11_ENUM_OP_CONV("__lt__",   a <  b);
                PYBIND11_ENUM_OP_CONV("__gt__",   a >  b);
                PYBIND11_ENUM_OP_CONV("__le__",   a <= b);
                PYBIND11_ENUM_OP_CONV("__ge__",   a >= b);
                PYBIND11_ENUM_OP_CONV("__and__",  a &  b);
                PYBIND11_ENUM_OP_CONV("__rand__", a &  b);
                PYBIND11_ENUM_OP_CONV("__or__",   a |  b);
                PYBIND11_ENUM_OP_CONV("__ror__",  a |  b);
                PYBIND11_ENUM_OP_CONV("__xor__",  a ^  b);
                PYBIND11_ENUM_OP_CONV("__rxor__", a ^  b);
                m_base.attr("__invert__") = cpp_function(
                    [](object arg) { return ~(int_(arg)); }, name("__invert__"), is_method(m_base));
            }
        } else {
            PYBIND11_ENUM_OP_STRICT("__eq__",  int_(a).equal(int_(b)), return false);
            PYBIND11_ENUM_OP_STRICT("__ne__", !int_(a).equal(int_(b)), return true);

            if (is_arithmetic) {
                #define PYBIND11_THROW throw type_error("Expected an enumeration of matching type!");
                PYBIND11_ENUM_OP_STRICT("__lt__", int_(a) <  int_(b), PYBIND11_THROW);
                PYBIND11_ENUM_OP_STRICT("__gt__", int_(a) >  int_(b), PYBIND11_THROW);
                PYBIND11_ENUM_OP_STRICT("__le__", int_(a) <= int_(b), PYBIND11_THROW);
                PYBIND11_ENUM_OP_STRICT("__ge__", int_(a) >= int_(b), PYBIND11_THROW);
                #undef PYBIND11_THROW
            }
        }

        #undef PYBIND11_ENUM_OP_CONV_LHS
        #undef PYBIND11_ENUM_OP_CONV
        #undef PYBIND11_ENUM_OP_STRICT

        m_base.attr("__getstate__") = cpp_function(
            [](object arg) { return int_(arg); }, name("__getstate__"), is_method(m_base));

        m_base.attr("__hash__") = cpp_function(
            [](object arg) { return int_(arg); }, name("__hash__"), is_method(m_base));
    }